

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Observer.cpp
# Opt level: O0

void f(int *i)

{
  ostream *poVar1;
  int *in_RDI;
  rep_conflict rVar2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff48;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff50;
  float *in_stack_ffffffffffffff68;
  duration<double,_std::ratio<1L,_1L>_> local_50 [2];
  undefined4 local_3c;
  undefined8 local_38;
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28 [4];
  int *local_8;
  
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f begin: ");
  local_38 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121a28);
  *local_8 = *local_8 + 1;
  local_3c = 0x3fc00000;
  depspawn::spawn<void(float),float>((_func_void_float *)poVar1,in_stack_ffffffffffffff68);
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_50);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121b43);
  return;
}

Assistant:

void f(int &i) {  
  LOG("f begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i++;
  
  spawn(longf, 1.5f);

  LOG("f finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}